

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O3

shared_ptr<helics::Core> helics::CoreFactory::findCore(string_view name)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<helics::Core> sVar2;
  long *local_38 [2];
  long local_28 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38);
  sVar2 = gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::findObject
                    ((SearchableObjectHolder<helics::Core,_helics::CoreType> *)name._M_len,
                     (string *)searchableCores);
  _Var1 = sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi
  ;
  sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)name._M_len;
  return (shared_ptr<helics::Core>)
         sVar2.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core> findCore(std::string_view name)
{
    return searchableCores.findObject(std::string{name});
}